

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray(SmallArray<LLVMTypeRefOpaque_*,_32U> *this)

{
  LLVMTypeRefOpaque **ppLVar1;
  
  ppLVar1 = this->data;
  if (ppLVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppLVar1 != (LLVMTypeRefOpaque **)0x0) {
        (*(code *)NULLC::dealloc)(ppLVar1);
      }
    }
    else if (ppLVar1 != (LLVMTypeRefOpaque **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}